

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O2

int __thiscall primesieve::CpuInfo::init(CpuInfo *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  primesieve_error *this_00;
  unsigned_long __val;
  string str;
  string threadSiblings;
  string threadSiblingsList;
  string sharedCpuMap;
  string sharedCpuList;
  string cacheSize;
  string cacheType;
  string type;
  string cacheLevel;
  string cpusOnline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string path;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cpusOnline,"/sys/devices/system/cpu/online",(allocator<char> *)&str);
  sVar4 = anon_unknown.dwarf_fc64a::parseThreadList(&cpusOnline);
  this->cpuThreads_ = sVar4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&threadSiblingsList,"/sys/devices/system/cpu/cpu0/topology/core_cpus_list",
             (allocator<char> *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&threadSiblings,"/sys/devices/system/cpu/cpu0/topology/core_cpus",
             (allocator<char> *)&str);
  sVar4 = anon_unknown.dwarf_fc64a::getThreads(&threadSiblingsList,&threadSiblings);
  this->threadsPerCore_ = sVar4;
  if (sVar4 == 0) {
    std::__cxx11::string::assign((char *)&threadSiblingsList);
    std::__cxx11::string::assign((char *)&threadSiblings);
    sVar4 = anon_unknown.dwarf_fc64a::getThreads(&threadSiblingsList,&threadSiblings);
    this->threadsPerCore_ = sVar4;
  }
  if (sVar4 - 1 < 0x400 && this->cpuThreads_ - 1 < 0x100000) {
    this->cpuCores_ = (this->cpuThreads_ & 0xffffffff) / (sVar4 & 0xffffffff);
  }
  __val = 0;
  do {
    if (__val == 4) {
      std::__cxx11::string::~string((string *)&threadSiblings);
      std::__cxx11::string::~string((string *)&threadSiblingsList);
      iVar3 = std::__cxx11::string::~string((string *)&cpusOnline);
      return iVar3;
    }
    std::__cxx11::to_string(&str,__val);
    std::operator+(&path,"/sys/devices/system/cpu/cpu0/cache/index",&str);
    std::__cxx11::string::~string((string *)&str);
    std::operator+(&cacheLevel,&path,"/level");
    anon_unknown.dwarf_fc64a::getString(&str,&cacheLevel);
    if (str._M_string_length == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = std::__cxx11::stoul(&str,(size_t *)0x0,10);
    }
    std::__cxx11::string::~string((string *)&str);
    if (uVar5 - 1 < 3) {
      std::operator+(&type,&path,"/type");
      anon_unknown.dwarf_fc64a::getString(&cacheType,&type);
      bVar2 = std::operator==(&cacheType,"Data");
      if (bVar2) {
LAB_0011e1a6:
        std::operator+(&cacheSize,&path,"/size");
        std::operator+(&sharedCpuList,&path,"/shared_cpu_list");
        std::operator+(&sharedCpuMap,&path,"/shared_cpu_map");
        anon_unknown.dwarf_fc64a::getString(&str,&cacheSize);
        if (str._M_string_length == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = std::__cxx11::stoul(&str,(size_t *)0x0,10);
          cVar1 = str._M_dataplus._M_p[str._M_string_length - 1];
          if (cVar1 == 'G') {
            uVar6 = uVar6 << 0x1e;
          }
          else if (cVar1 == 'K') {
            uVar6 = uVar6 << 10;
          }
          else if (cVar1 == 'M') {
            uVar6 = uVar6 << 0x14;
          }
          else if (9 < (int)cVar1 - 0x30U) {
            this_00 = (primesieve_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_70,"invalid cache size: ",&str);
            primesieve_error::primesieve_error(this_00,&local_70);
            __cxa_throw(this_00,&primesieve_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        std::__cxx11::string::~string((string *)&str);
        (this->cacheSizes_)._M_elems[uVar5] = uVar6;
        sVar4 = anon_unknown.dwarf_fc64a::getThreads(&sharedCpuList,&sharedCpuMap);
        (this->cacheSharing_)._M_elems[uVar5] = sVar4;
        std::__cxx11::string::~string((string *)&sharedCpuMap);
        std::__cxx11::string::~string((string *)&sharedCpuList);
        std::__cxx11::string::~string((string *)&cacheSize);
      }
      else {
        bVar2 = std::operator==(&cacheType,"Unified");
        if (bVar2) goto LAB_0011e1a6;
      }
      std::__cxx11::string::~string((string *)&cacheType);
      std::__cxx11::string::~string((string *)&type);
    }
    std::__cxx11::string::~string((string *)&cacheLevel);
    std::__cxx11::string::~string((string *)&path);
    __val = __val + 1;
  } while( true );
}

Assistant:

void CpuInfo::init()
{
  string cpusOnline = "/sys/devices/system/cpu/online";
  cpuThreads_ = parseThreadList(cpusOnline);

  // Works on Linux kernel >= 5.3
  string threadSiblingsList = "/sys/devices/system/cpu/cpu0/topology/core_cpus_list";
  string threadSiblings = "/sys/devices/system/cpu/cpu0/topology/core_cpus";
  threadsPerCore_ = getThreads(threadSiblingsList, threadSiblings);

  if (!threadsPerCore_)
  {
    // Works on Linux kernel < 5.3
    threadSiblingsList = "/sys/devices/system/cpu/cpu0/topology/thread_siblings_list";
    threadSiblings = "/sys/devices/system/cpu/cpu0/topology/thread_siblings";
    threadsPerCore_ = getThreads(threadSiblingsList, threadSiblings);
  }

  if (hasCpuThreads() &&
      hasThreadsPerCore())
    cpuCores_ = cpuThreads_ / threadsPerCore_;

  // Retrieve CPU cache info
  for (size_t i = 0; i <= 3; i++)
  {
    string path = "/sys/devices/system/cpu/cpu0/cache/index" + to_string(i);
    string cacheLevel = path + "/level";
    size_t level = getValue(cacheLevel);

    if (level >= 1 &&
        level <= 3)
    {
      string type = path + "/type";
      string cacheType = getString(type);

      if (cacheType == "Data" ||
          cacheType == "Unified")
      {
        string cacheSize = path + "/size";
        string sharedCpuList = path + "/shared_cpu_list";
        string sharedCpuMap = path + "/shared_cpu_map";
        cacheSizes_[level] = getCacheSize(cacheSize);
        cacheSharing_[level] = getThreads(sharedCpuList, sharedCpuMap);
      }
    }
  }
}